

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::string_const&>
          (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          basic_csv_decode_options<char> *options,error_code *ec)

{
  undefined1 local_29;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&),_jsoncons::csv::default_csv_parsing>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&),_jsoncons::csv::default_csv_parsing>
             ::_M_manager;
  basic_csv_cursor<std::__cxx11::string_const&>(this,&local_29,source,options,&local_28,ec,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

basic_csv_cursor(Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options,
        std::error_code& ec)
        : basic_csv_cursor(std::allocator_arg, Allocator(),
              std::forward<Sourceable>(source),
              options,
              default_csv_parsing(),
              ec)
    {
    }